

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.h
# Opt level: O2

void fdct8x8_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined7 in_register_00000011;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  __m128i alVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  __m128i alVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  __m128i alVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  __m128i alVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  uVar3 = (uint)CONCAT71(in_register_00000011,cos_bit);
  auVar8 = ZEXT416(uVar3);
  iVar2 = 1 << (cos_bit - 1U & 0x1f);
  lVar4 = (long)(int)uVar3 * 0x100;
  uVar3 = *(uint *)((long)vert_filter_length_chroma + lVar4 + 0x1e0);
  uVar5 = -uVar3 & 0xffff | uVar3 * 0x10000;
  auVar52._4_4_ = uVar5;
  auVar52._0_4_ = uVar5;
  auVar52._8_4_ = uVar5;
  auVar52._12_4_ = uVar5;
  iVar6 = (uVar3 & 0xffff) * 0x10001;
  auVar44._4_4_ = iVar6;
  auVar44._0_4_ = iVar6;
  auVar44._8_4_ = iVar6;
  auVar44._12_4_ = iVar6;
  auVar31 = paddsw((undefined1  [16])*input,(undefined1  [16])input[7]);
  auVar10 = psubsw((undefined1  [16])*input,(undefined1  [16])input[7]);
  auVar20 = paddsw((undefined1  [16])input[1],(undefined1  [16])input[6]);
  auVar25 = psubsw((undefined1  [16])input[1],(undefined1  [16])input[6]);
  auVar65 = paddsw((undefined1  [16])input[2],(undefined1  [16])input[5]);
  auVar34 = psubsw((undefined1  [16])input[2],(undefined1  [16])input[5]);
  auVar61 = paddsw((undefined1  [16])input[3],(undefined1  [16])input[4]);
  auVar9 = psubsw((undefined1  [16])input[3],(undefined1  [16])input[4]);
  auVar56 = paddsw(auVar31,auVar61);
  auVar61 = psubsw(auVar31,auVar61);
  auVar62 = paddsw(auVar20,auVar65);
  auVar31 = psubsw(auVar20,auVar65);
  auVar16._0_12_ = auVar34._0_12_;
  auVar16._12_2_ = auVar34._6_2_;
  auVar16._14_2_ = auVar25._6_2_;
  auVar15._12_4_ = auVar16._12_4_;
  auVar15._0_10_ = auVar34._0_10_;
  auVar15._10_2_ = auVar25._4_2_;
  auVar14._10_6_ = auVar15._10_6_;
  auVar14._0_8_ = auVar34._0_8_;
  auVar14._8_2_ = auVar34._4_2_;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._6_2_ = auVar25._2_2_;
  auVar13._4_2_ = auVar34._2_2_;
  auVar13._0_2_ = auVar34._0_2_;
  auVar13._2_2_ = auVar25._0_2_;
  auVar35._2_2_ = auVar25._8_2_;
  auVar35._0_2_ = auVar34._8_2_;
  auVar35._4_2_ = auVar34._10_2_;
  auVar35._6_2_ = auVar25._10_2_;
  auVar35._8_2_ = auVar34._12_2_;
  auVar35._10_2_ = auVar25._12_2_;
  auVar35._12_2_ = auVar34._14_2_;
  auVar35._14_2_ = auVar25._14_2_;
  auVar20 = pmaddwd(auVar13,auVar52);
  auVar25 = pmaddwd(auVar52,auVar35);
  auVar26._0_4_ = auVar20._0_4_ + iVar2 >> auVar8;
  auVar26._4_4_ = auVar20._4_4_ + iVar2 >> auVar8;
  auVar26._8_4_ = auVar20._8_4_ + iVar2 >> auVar8;
  auVar26._12_4_ = auVar20._12_4_ + iVar2 >> auVar8;
  auVar53._0_4_ = auVar25._0_4_ + iVar2 >> auVar8;
  auVar53._4_4_ = auVar25._4_4_ + iVar2 >> auVar8;
  auVar53._8_4_ = auVar25._8_4_ + iVar2 >> auVar8;
  auVar53._12_4_ = auVar25._12_4_ + iVar2 >> auVar8;
  iVar6 = (uVar3 & 0xffff) + uVar3 * -0x10000;
  auVar25 = packssdw(auVar26,auVar53);
  auVar66._4_4_ = iVar6;
  auVar66._0_4_ = iVar6;
  auVar66._8_4_ = iVar6;
  auVar66._12_4_ = iVar6;
  uVar3 = *(uint *)((long)vert_filter_length_chroma + lVar4 + 0x220);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x1a0);
  uVar5 = iVar6 << 0x10 | uVar3 & 0xffff;
  auVar20 = pmaddwd(auVar13,auVar44);
  auVar34 = pmaddwd(auVar35,auVar44);
  auVar17._0_4_ = auVar20._0_4_ + iVar2 >> auVar8;
  auVar17._4_4_ = auVar20._4_4_ + iVar2 >> auVar8;
  auVar17._8_4_ = auVar20._8_4_ + iVar2 >> auVar8;
  auVar17._12_4_ = auVar20._12_4_ + iVar2 >> auVar8;
  auVar36._0_4_ = auVar34._0_4_ + iVar2 >> auVar8;
  auVar36._4_4_ = auVar34._4_4_ + iVar2 >> auVar8;
  auVar36._8_4_ = auVar34._8_4_ + iVar2 >> auVar8;
  auVar36._12_4_ = auVar34._12_4_ + iVar2 >> auVar8;
  auVar20 = packssdw(auVar17,auVar36);
  auVar40._0_12_ = auVar56._0_12_;
  auVar40._12_2_ = auVar56._6_2_;
  auVar40._14_2_ = auVar62._6_2_;
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = auVar56._0_10_;
  auVar39._10_2_ = auVar62._4_2_;
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = auVar56._0_8_;
  auVar38._8_2_ = auVar56._4_2_;
  auVar37._8_8_ = auVar38._8_8_;
  auVar37._6_2_ = auVar62._2_2_;
  auVar37._4_2_ = auVar56._2_2_;
  auVar37._0_2_ = auVar56._0_2_;
  auVar37._2_2_ = auVar62._0_2_;
  auVar57._2_2_ = auVar62._8_2_;
  auVar57._0_2_ = auVar56._8_2_;
  auVar57._4_2_ = auVar56._10_2_;
  auVar57._6_2_ = auVar62._10_2_;
  auVar57._8_2_ = auVar56._12_2_;
  auVar57._10_2_ = auVar62._12_2_;
  auVar57._12_2_ = auVar56._14_2_;
  auVar57._14_2_ = auVar62._14_2_;
  auVar62 = pmaddwd(auVar37,auVar44);
  auVar56 = pmaddwd(auVar44,auVar57);
  auVar34 = pmaddwd(auVar37,auVar66);
  auVar65 = pmaddwd(auVar57,auVar66);
  auVar63._4_4_ = uVar5;
  auVar63._0_4_ = uVar5;
  auVar63._8_4_ = uVar5;
  auVar63._12_4_ = uVar5;
  uVar3 = uVar3 << 0x10 | -iVar6 & 0xffffU;
  auVar54._0_4_ = auVar62._0_4_ + iVar2 >> auVar8;
  auVar54._4_4_ = auVar62._4_4_ + iVar2 >> auVar8;
  auVar54._8_4_ = auVar62._8_4_ + iVar2 >> auVar8;
  auVar54._12_4_ = auVar62._12_4_ + iVar2 >> auVar8;
  auVar45._0_4_ = auVar56._0_4_ + iVar2 >> auVar8;
  auVar45._4_4_ = auVar56._4_4_ + iVar2 >> auVar8;
  auVar45._8_4_ = auVar56._8_4_ + iVar2 >> auVar8;
  auVar45._12_4_ = auVar56._12_4_ + iVar2 >> auVar8;
  alVar55 = (__m128i)packssdw(auVar54,auVar45);
  auVar41._0_4_ = auVar34._0_4_ + iVar2 >> auVar8;
  auVar41._4_4_ = auVar34._4_4_ + iVar2 >> auVar8;
  auVar41._8_4_ = auVar34._8_4_ + iVar2 >> auVar8;
  auVar41._12_4_ = auVar34._12_4_ + iVar2 >> auVar8;
  auVar58._0_4_ = auVar65._0_4_ + iVar2 >> auVar8;
  auVar58._4_4_ = auVar65._4_4_ + iVar2 >> auVar8;
  auVar58._8_4_ = auVar65._8_4_ + iVar2 >> auVar8;
  auVar58._12_4_ = auVar65._12_4_ + iVar2 >> auVar8;
  auVar67._4_4_ = uVar3;
  auVar67._0_4_ = uVar3;
  auVar67._8_4_ = uVar3;
  auVar67._12_4_ = uVar3;
  alVar42 = (__m128i)packssdw(auVar41,auVar58);
  auVar49._0_12_ = auVar31._0_12_;
  auVar49._12_2_ = auVar31._6_2_;
  auVar49._14_2_ = auVar61._6_2_;
  auVar48._12_4_ = auVar49._12_4_;
  auVar48._0_10_ = auVar31._0_10_;
  auVar48._10_2_ = auVar61._4_2_;
  auVar47._10_6_ = auVar48._10_6_;
  auVar47._0_8_ = auVar31._0_8_;
  auVar47._8_2_ = auVar31._4_2_;
  auVar46._8_8_ = auVar47._8_8_;
  auVar46._6_2_ = auVar61._2_2_;
  auVar46._4_2_ = auVar31._2_2_;
  auVar46._0_2_ = auVar31._0_2_;
  auVar46._2_2_ = auVar61._0_2_;
  auVar21._2_2_ = auVar61._8_2_;
  auVar21._0_2_ = auVar31._8_2_;
  auVar21._4_2_ = auVar31._10_2_;
  auVar21._6_2_ = auVar61._10_2_;
  auVar21._8_2_ = auVar31._12_2_;
  auVar21._10_2_ = auVar61._12_2_;
  auVar21._12_2_ = auVar31._14_2_;
  auVar21._14_2_ = auVar61._14_2_;
  auVar34 = pmaddwd(auVar46,auVar63);
  auVar56 = pmaddwd(auVar63,auVar21);
  auVar61 = pmaddwd(auVar46,auVar67);
  auVar31 = pmaddwd(auVar21,auVar67);
  auVar59._0_4_ = auVar34._0_4_ + iVar2 >> auVar8;
  auVar59._4_4_ = auVar34._4_4_ + iVar2 >> auVar8;
  auVar59._8_4_ = auVar34._8_4_ + iVar2 >> auVar8;
  auVar59._12_4_ = auVar34._12_4_ + iVar2 >> auVar8;
  auVar64._0_4_ = auVar56._0_4_ + iVar2 >> auVar8;
  auVar64._4_4_ = auVar56._4_4_ + iVar2 >> auVar8;
  auVar64._8_4_ = auVar56._8_4_ + iVar2 >> auVar8;
  auVar64._12_4_ = auVar56._12_4_ + iVar2 >> auVar8;
  alVar60 = (__m128i)packssdw(auVar59,auVar64);
  auVar50._0_4_ = auVar61._0_4_ + iVar2 >> auVar8;
  auVar50._4_4_ = auVar61._4_4_ + iVar2 >> auVar8;
  auVar50._8_4_ = auVar61._8_4_ + iVar2 >> auVar8;
  auVar50._12_4_ = auVar61._12_4_ + iVar2 >> auVar8;
  auVar22._0_4_ = auVar31._0_4_ + iVar2 >> auVar8;
  auVar22._4_4_ = auVar31._4_4_ + iVar2 >> auVar8;
  auVar22._8_4_ = auVar31._8_4_ + iVar2 >> auVar8;
  auVar22._12_4_ = auVar31._12_4_ + iVar2 >> auVar8;
  alVar51 = (__m128i)packssdw(auVar50,auVar22);
  auVar56 = paddsw(auVar9,auVar25);
  auVar9 = psubsw(auVar9,auVar25);
  auVar23 = psubsw(auVar10,auVar20);
  auVar10 = paddsw(auVar20,auVar10);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x180);
  uVar3 = *(uint *)((long)vert_filter_length_chroma + lVar4 + 0x240);
  uVar5 = *(uint *)((long)vert_filter_length_chroma + lVar4 + 0x1c0);
  iVar1 = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x200);
  *output = alVar55;
  uVar7 = iVar6 << 0x10 | uVar3 & 0xffff;
  output[4] = alVar42;
  auVar27._4_4_ = uVar7;
  auVar27._0_4_ = uVar7;
  auVar27._8_4_ = uVar7;
  auVar27._12_4_ = uVar7;
  uVar3 = uVar3 << 0x10 | -iVar6 & 0xffffU;
  output[2] = alVar60;
  auVar43._4_4_ = uVar3;
  auVar43._0_4_ = uVar3;
  auVar43._8_4_ = uVar3;
  auVar43._12_4_ = uVar3;
  output[6] = alVar51;
  auVar34._0_12_ = auVar56._0_12_;
  auVar34._12_2_ = auVar56._6_2_;
  auVar34._14_2_ = auVar10._6_2_;
  auVar61._12_4_ = auVar34._12_4_;
  auVar61._0_10_ = auVar56._0_10_;
  auVar61._10_2_ = auVar10._4_2_;
  auVar25._10_6_ = auVar61._10_6_;
  auVar25._0_8_ = auVar56._0_8_;
  auVar25._8_2_ = auVar56._4_2_;
  auVar31._8_8_ = auVar25._8_8_;
  auVar31._6_2_ = auVar10._2_2_;
  auVar31._4_2_ = auVar56._2_2_;
  auVar31._0_2_ = auVar56._0_2_;
  auVar31._2_2_ = auVar10._0_2_;
  auVar32._2_2_ = auVar10._8_2_;
  auVar32._0_2_ = auVar56._8_2_;
  auVar32._4_2_ = auVar56._10_2_;
  auVar32._6_2_ = auVar10._10_2_;
  auVar32._8_2_ = auVar56._12_2_;
  auVar32._10_2_ = auVar10._12_2_;
  auVar32._12_2_ = auVar56._14_2_;
  auVar32._14_2_ = auVar10._14_2_;
  auVar20 = pmaddwd(auVar31,auVar27);
  auVar25 = pmaddwd(auVar27,auVar32);
  auVar10 = pmaddwd(auVar31,auVar43);
  auVar18._0_4_ = auVar20._0_4_ + iVar2 >> auVar8;
  auVar18._4_4_ = auVar20._4_4_ + iVar2 >> auVar8;
  auVar18._8_4_ = auVar20._8_4_ + iVar2 >> auVar8;
  auVar18._12_4_ = auVar20._12_4_ + iVar2 >> auVar8;
  auVar28._0_4_ = auVar25._0_4_ + iVar2 >> auVar8;
  auVar28._4_4_ = auVar25._4_4_ + iVar2 >> auVar8;
  auVar28._8_4_ = auVar25._8_4_ + iVar2 >> auVar8;
  auVar28._12_4_ = auVar25._12_4_ + iVar2 >> auVar8;
  auVar20 = pmaddwd(auVar32,auVar43);
  alVar51 = (__m128i)packssdw(auVar18,auVar28);
  auVar56._0_4_ = auVar10._0_4_ + iVar2 >> auVar8;
  auVar56._4_4_ = auVar10._4_4_ + iVar2 >> auVar8;
  auVar56._8_4_ = auVar10._8_4_ + iVar2 >> auVar8;
  auVar56._12_4_ = auVar10._12_4_ + iVar2 >> auVar8;
  auVar33._0_4_ = auVar20._0_4_ + iVar2 >> auVar8;
  auVar33._4_4_ = auVar20._4_4_ + iVar2 >> auVar8;
  auVar33._8_4_ = auVar20._8_4_ + iVar2 >> auVar8;
  auVar33._12_4_ = auVar20._12_4_ + iVar2 >> auVar8;
  uVar3 = iVar1 << 0x10 | uVar5 & 0xffff;
  alVar42 = (__m128i)packssdw(auVar56,auVar33);
  auVar29._4_4_ = uVar3;
  auVar29._0_4_ = uVar3;
  auVar29._8_4_ = uVar3;
  auVar29._12_4_ = uVar3;
  uVar3 = uVar5 << 0x10 | -iVar1 & 0xffffU;
  output[1] = alVar51;
  auVar19._4_4_ = uVar3;
  auVar19._0_4_ = uVar3;
  auVar19._8_4_ = uVar3;
  auVar19._12_4_ = uVar3;
  output[7] = alVar42;
  auVar65._0_12_ = auVar9._0_12_;
  auVar65._12_2_ = auVar9._6_2_;
  auVar65._14_2_ = auVar23._6_2_;
  auVar12._12_4_ = auVar65._12_4_;
  auVar12._0_10_ = auVar9._0_10_;
  auVar12._10_2_ = auVar23._4_2_;
  auVar62._10_6_ = auVar12._10_6_;
  auVar62._0_8_ = auVar9._0_8_;
  auVar62._8_2_ = auVar9._4_2_;
  auVar11._8_8_ = auVar62._8_8_;
  auVar11._6_2_ = auVar23._2_2_;
  auVar11._4_2_ = auVar9._2_2_;
  auVar11._0_2_ = auVar9._0_2_;
  auVar11._2_2_ = auVar23._0_2_;
  auVar10._2_2_ = auVar23._8_2_;
  auVar10._0_2_ = auVar9._8_2_;
  auVar10._4_2_ = auVar9._10_2_;
  auVar10._6_2_ = auVar23._10_2_;
  auVar10._8_2_ = auVar9._12_2_;
  auVar10._10_2_ = auVar23._12_2_;
  auVar10._12_2_ = auVar9._14_2_;
  auVar10._14_2_ = auVar23._14_2_;
  auVar31 = pmaddwd(auVar11,auVar29);
  auVar25 = pmaddwd(auVar29,auVar10);
  auVar20 = pmaddwd(auVar11,auVar19);
  auVar9 = pmaddwd(auVar10,auVar19);
  auVar24._0_4_ = auVar31._0_4_ + iVar2 >> auVar8;
  auVar24._4_4_ = auVar31._4_4_ + iVar2 >> auVar8;
  auVar24._8_4_ = auVar31._8_4_ + iVar2 >> auVar8;
  auVar24._12_4_ = auVar31._12_4_ + iVar2 >> auVar8;
  auVar30._0_4_ = auVar25._0_4_ + iVar2 >> auVar8;
  auVar30._4_4_ = auVar25._4_4_ + iVar2 >> auVar8;
  auVar30._8_4_ = auVar25._8_4_ + iVar2 >> auVar8;
  auVar30._12_4_ = auVar25._12_4_ + iVar2 >> auVar8;
  auVar23._0_4_ = auVar20._0_4_ + iVar2 >> auVar8;
  auVar23._4_4_ = auVar20._4_4_ + iVar2 >> auVar8;
  auVar23._8_4_ = auVar20._8_4_ + iVar2 >> auVar8;
  auVar23._12_4_ = auVar20._12_4_ + iVar2 >> auVar8;
  auVar20._0_4_ = auVar9._0_4_ + iVar2 >> auVar8;
  auVar20._4_4_ = auVar9._4_4_ + iVar2 >> auVar8;
  auVar20._8_4_ = auVar9._8_4_ + iVar2 >> auVar8;
  auVar20._12_4_ = auVar9._12_4_ + iVar2 >> auVar8;
  alVar51 = (__m128i)packssdw(auVar24,auVar30);
  alVar42 = (__m128i)packssdw(auVar23,auVar20);
  output[5] = alVar51;
  output[3] = alVar42;
  return;
}

Assistant:

static inline void fdct8x8_new_sse2(const __m128i *input, __m128i *output,
                                    int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));

  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  const __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  const __m128i cospi_p24_p40 = pair_set_epi16(cospi[24], cospi[40]);
  const __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);

  // stage 1
  __m128i x1[8];
  x1[0] = _mm_adds_epi16(input[0], input[7]);
  x1[7] = _mm_subs_epi16(input[0], input[7]);
  x1[1] = _mm_adds_epi16(input[1], input[6]);
  x1[6] = _mm_subs_epi16(input[1], input[6]);
  x1[2] = _mm_adds_epi16(input[2], input[5]);
  x1[5] = _mm_subs_epi16(input[2], input[5]);
  x1[3] = _mm_adds_epi16(input[3], input[4]);
  x1[4] = _mm_subs_epi16(input[3], input[4]);

  // stage 2
  __m128i x2[8];
  x2[0] = _mm_adds_epi16(x1[0], x1[3]);
  x2[3] = _mm_subs_epi16(x1[0], x1[3]);
  x2[1] = _mm_adds_epi16(x1[1], x1[2]);
  x2[2] = _mm_subs_epi16(x1[1], x1[2]);
  x2[4] = x1[4];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x1[5], x1[6], x2[5], x2[6]);
  x2[7] = x1[7];

  // stage 3
  __m128i x3[8];
  btf_16_sse2(cospi_p32_p32, cospi_p32_m32, x2[0], x2[1], x3[0], x3[1]);
  btf_16_sse2(cospi_p48_p16, cospi_m16_p48, x2[2], x2[3], x3[2], x3[3]);
  x3[4] = _mm_adds_epi16(x2[4], x2[5]);
  x3[5] = _mm_subs_epi16(x2[4], x2[5]);
  x3[6] = _mm_subs_epi16(x2[7], x2[6]);
  x3[7] = _mm_adds_epi16(x2[7], x2[6]);

  // stage 4 and 5
  output[0] = x3[0];
  output[4] = x3[1];
  output[2] = x3[2];
  output[6] = x3[3];
  btf_16_sse2(cospi_p56_p08, cospi_m08_p56, x3[4], x3[7], output[1], output[7]);
  btf_16_sse2(cospi_p24_p40, cospi_m40_p24, x3[5], x3[6], output[5], output[3]);
}